

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

bool parseModeline(QByteArray *text,drmModeModeInfoPtr mode)

{
  int iVar1;
  char *pcVar2;
  undefined4 *in_RSI;
  long in_FS_OFFSET;
  float fclock;
  char vsync [16];
  char hsync [16];
  bool local_4d;
  float local_4c;
  char local_48 [16];
  undefined8 local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_48[0] = -0x56;
  local_48[1] = -0x56;
  local_48[2] = -0x56;
  local_48[3] = -0x56;
  local_48[4] = -0x56;
  local_48[5] = -0x56;
  local_48[6] = -0x56;
  local_48[7] = -0x56;
  local_48[8] = -0x56;
  local_48[9] = -0x56;
  local_48[10] = -0x56;
  local_48[0xb] = -0x56;
  local_48[0xc] = -0x56;
  local_48[0xd] = -0x56;
  local_48[0xe] = -0x56;
  local_48[0xf] = -0x56;
  local_4c = -NAN;
  in_RSI[8] = 0x20;
  *(undefined2 *)(in_RSI + 3) = 0;
  *(undefined2 *)((long)in_RSI + 0x16) = 0;
  in_RSI[6] = 0;
  in_RSI[7] = 0;
  pcVar2 = QByteArray::constData((QByteArray *)0x12764b);
  iVar1 = __isoc99_sscanf(pcVar2,"%f %hd %hd %hd %hd %hd %hd %hd %hd %15s %15s",&local_4c,in_RSI + 1
                          ,(long)in_RSI + 6,in_RSI + 2,(long)in_RSI + 10,(long)in_RSI + 0xe,
                          in_RSI + 4,(long)in_RSI + 0x12,in_RSI + 5,&local_38,local_48);
  if (iVar1 == 0xb) {
    *in_RSI = (int)(long)(local_4c * 1000.0);
    iVar1 = strcmp((char *)&local_38,"+hsync");
    if (iVar1 == 0) {
      in_RSI[7] = in_RSI[7] | 1;
    }
    else {
      iVar1 = strcmp((char *)&local_38,"-hsync");
      if (iVar1 != 0) {
        local_4d = false;
        goto LAB_001277b3;
      }
      in_RSI[7] = in_RSI[7] | 2;
    }
    iVar1 = strcmp(local_48,"+vsync");
    if (iVar1 == 0) {
      in_RSI[7] = in_RSI[7] | 4;
    }
    else {
      iVar1 = strcmp(local_48,"-vsync");
      if (iVar1 != 0) {
        local_4d = false;
        goto LAB_001277b3;
      }
      in_RSI[7] = in_RSI[7] | 8;
    }
    local_4d = true;
  }
  else {
    local_4d = false;
  }
LAB_001277b3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return local_4d;
  }
  __stack_chk_fail();
}

Assistant:

static bool parseModeline(const QByteArray &text, drmModeModeInfoPtr mode)
{
    char hsync[16];
    char vsync[16];
    float fclock;

    mode->type = DRM_MODE_TYPE_USERDEF;
    mode->hskew = 0;
    mode->vscan = 0;
    mode->vrefresh = 0;
    mode->flags = 0;

    if (sscanf(text.constData(), "%f %hd %hd %hd %hd %hd %hd %hd %hd %15s %15s",
               &fclock,
               &mode->hdisplay,
               &mode->hsync_start,
               &mode->hsync_end,
               &mode->htotal,
               &mode->vdisplay,
               &mode->vsync_start,
               &mode->vsync_end,
               &mode->vtotal, hsync, vsync) != 11)
        return false;

    mode->clock = fclock * 1000;

    if (strcmp(hsync, "+hsync") == 0)
        mode->flags |= DRM_MODE_FLAG_PHSYNC;
    else if (strcmp(hsync, "-hsync") == 0)
        mode->flags |= DRM_MODE_FLAG_NHSYNC;
    else
        return false;

    if (strcmp(vsync, "+vsync") == 0)
        mode->flags |= DRM_MODE_FLAG_PVSYNC;
    else if (strcmp(vsync, "-vsync") == 0)
        mode->flags |= DRM_MODE_FLAG_NVSYNC;
    else
        return false;

    return true;
}